

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-metadce.cpp
# Opt level: O2

void __thiscall MetaDCEGraph::dump(MetaDCEGraph *this)

{
  _Hash_node_base o;
  _Hash_node_base *p_Var1;
  size_t sVar2;
  undefined8 *puVar3;
  char *pcVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  iterator iVar7;
  ostream *this_00;
  _Base_ptr in_RCX;
  long *plVar8;
  __node_base *p_Var9;
  size_t *psVar10;
  undefined8 *puVar11;
  Name name;
  Name name_00;
  Name name_01;
  Name name_02;
  undefined1 local_68 [8];
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  importMap;
  
  std::operator<<((ostream *)&std::cout,"=== graph ===\n");
  p_Var9 = &(this->roots)._M_h._M_before_begin;
  importMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  while (p_Var9 = p_Var9->_M_nxt, p_Var9 != (__node_base *)0x0) {
    o._M_nxt = p_Var9[1]._M_nxt;
    p_Var1 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var9 + 2))->_M_max_load_factor;
    poVar5 = std::operator<<((ostream *)&std::cout,"root: ");
    name.super_IString.str._M_str = (char *)in_RCX;
    name.super_IString.str._M_len = (size_t)p_Var1;
    poVar5 = wasm::operator<<((wasm *)poVar5,(ostream *)o._M_nxt,name);
    std::operator<<(poVar5,'\n');
  }
  importMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&importMap;
  importMap._M_t._M_impl._0_4_ = 0;
  importMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  importMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  importMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  plVar8 = (long *)(importMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 0xf0);
  importMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       importMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  while (plVar8 = (long *)*plVar8, plVar8 != (long *)0x0) {
    pmVar6 = std::
             map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
             ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                           *)local_68,(key_type *)(plVar8 + 3));
    pcVar4 = (char *)plVar8[2];
    (pmVar6->super_IString).str._M_len = plVar8[1];
    (pmVar6->super_IString).str._M_str = pcVar4;
  }
  psVar10 = (size_t *)(importMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10);
  while (sVar2 = *psVar10, sVar2 != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"node: ");
    name_00.super_IString.str._M_str = (char *)in_RCX;
    name_00.super_IString.str._M_len = *(size_t *)(sVar2 + 0x10);
    poVar5 = wasm::operator<<((wasm *)poVar5,*(ostream **)(sVar2 + 8),name_00);
    std::operator<<(poVar5,'\n');
    iVar7 = std::
            _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
            ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                    *)local_68,(key_type *)(sVar2 + 8));
    in_RCX = (_Base_ptr)&importMap;
    if (iVar7._M_node != in_RCX) {
      poVar5 = std::operator<<((ostream *)&std::cout,"  is import ");
      pmVar6 = std::
               map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                             *)local_68,(key_type *)(sVar2 + 8));
      name_01.super_IString.str._M_str = (char *)in_RCX;
      name_01.super_IString.str._M_len = (size_t)(pmVar6->super_IString).str._M_str;
      poVar5 = wasm::operator<<((wasm *)poVar5,(ostream *)(pmVar6->super_IString).str._M_len,name_01
                               );
      std::operator<<(poVar5,'\n');
    }
    puVar3 = *(undefined8 **)(sVar2 + 0x30);
    importMap._M_t._M_impl.super__Rb_tree_header._M_node_count = sVar2;
    for (puVar11 = *(undefined8 **)(sVar2 + 0x28);
        psVar10 = (size_t *)importMap._M_t._M_impl.super__Rb_tree_header._M_node_count,
        puVar11 != puVar3; puVar11 = puVar11 + 2) {
      poVar5 = (ostream *)*puVar11;
      sVar2 = puVar11[1];
      this_00 = std::operator<<((ostream *)&std::cout,"  reaches: ");
      name_02.super_IString.str._M_str = (char *)in_RCX;
      name_02.super_IString.str._M_len = sVar2;
      poVar5 = wasm::operator<<((wasm *)this_00,poVar5,name_02);
      std::operator<<(poVar5,'\n');
    }
  }
  std::operator<<((ostream *)&std::cout,"=============\n");
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               *)local_68);
  return;
}

Assistant:

void dump() {
    std::cout << "=== graph ===\n";
    for (auto root : roots) {
      std::cout << "root: " << root << '\n';
    }
    std::map<Name, ImportId> importMap;
    for (auto& [id, dceName] : importIdToDCENode) {
      importMap[dceName] = id;
    }
    for (auto& [name, node] : nodes) {
      std::cout << "node: " << name << '\n';
      if (importMap.find(name) != importMap.end()) {
        std::cout << "  is import " << importMap[name] << '\n';
      }
      for (auto target : node.reaches) {
        std::cout << "  reaches: " << target << '\n';
      }
    }
    std::cout << "=============\n";
  }